

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_crashes.cpp
# Opt level: O2

void __thiscall CrashTest_SigsegvTest_Test::TestBody(CrashTest_SigsegvTest_Test *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *message;
  DeathTest *gtest_dt;
  ReturnSentinel gtest_sentinel;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  AssertHelper local_e0 [4];
  RE local_c0;
  
  bVar2 = testing::internal::AlwaysTrue();
  if (!bVar2) goto LAB_0010a6a4;
  testing::internal::RE::Init(&local_c0,"");
  bVar2 = testing::internal::DeathTest::Create
                    ("RaiseSigsegv()",&local_c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_crashes.cpp"
                     ,0x1a,&gtest_dt);
  if (bVar2) {
    if (gtest_dt != (DeathTest *)0x0) {
      gtest_dt_ptr.ptr_ = gtest_dt;
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])();
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*gtest_dt->_vptr_DeathTest[4])(gtest_dt,(ulong)bVar2);
        if ((char)iVar3 != '\0') goto LAB_0010a680;
        bVar2 = true;
        bVar1 = false;
      }
      else {
        if (iVar3 == 1) {
          gtest_sentinel.test_ = gtest_dt;
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            RaiseSigsegv();
          }
          (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
        }
LAB_0010a680:
        bVar2 = false;
        bVar1 = true;
      }
      testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr(&gtest_dt_ptr);
      if (!bVar1) goto LAB_0010a696;
    }
    bVar2 = false;
  }
  else {
    bVar2 = true;
  }
LAB_0010a696:
  testing::internal::RE::~RE(&local_c0);
  if (!bVar2) {
    return;
  }
LAB_0010a6a4:
  testing::Message::Message((Message *)&local_c0);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (local_e0,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_crashes.cpp"
             ,0x1a,message);
  testing::internal::AssertHelper::operator=(local_e0,(Message *)&local_c0);
  testing::internal::AssertHelper::~AssertHelper(local_e0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_c0);
  return;
}

Assistant:

TEST (CrashTest, SigsegvTest) {
    ASSERT_DEATH(RaiseSigsegv(), "");
}